

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

StringPtr kj::_::convertToReturn<kj::StringPtr>(ExceptionOr<kj::StringPtr> *result)

{
  StringPtr *pSVar1;
  Exception *pEVar2;
  ArrayPtr<const_char> *pAVar3;
  Exception *exception_1;
  Exception *_exception92;
  Exception *exception;
  Exception *_exception88;
  StringPtr *value;
  StringPtr *_value87;
  ExceptionOr<kj::StringPtr> *result_local;
  
  pSVar1 = readMaybe<kj::StringPtr>(&result->value);
  if (pSVar1 != (StringPtr *)0x0) {
    pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)result);
    if (pEVar2 != (Exception *)0x0) {
      pEVar2 = mv<kj::Exception>(pEVar2);
      throwRecoverableException(pEVar2,0);
    }
    pSVar1 = mv<kj::StringPtr>(pSVar1);
    pAVar3 = &returnMaybeVoid<kj::StringPtr>(pSVar1)->content;
    return (StringPtr)*pAVar3;
  }
  pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)result);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwFatalException(pEVar2,0);
  }
  unreachable();
}

Assistant:

inline T convertToReturn(ExceptionOr<T>&& result) {
  KJ_IF_SOME(value, result.value) {
    KJ_IF_SOME(exception, result.exception) {
      throwRecoverableException(kj::mv(exception));
    }
    return _::returnMaybeVoid(kj::mv(value));
  } else KJ_IF_SOME(exception, result.exception) {
    throwFatalException(kj::mv(exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }